

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

size_t __thiscall
QPDF::recoverStreamLength
          (QPDF *this,shared_ptr<InputSource> *input,QPDFObjGen og,qpdf_offset_t stream_offset)

{
  unsigned_long uVar1;
  bool bVar2;
  int iVar3;
  element_type *peVar4;
  pointer pMVar5;
  undefined4 extraout_var;
  string *__lhs;
  element_type *this_00;
  qpdf_offset_t qVar6;
  qpdf_offset_t qVar7;
  string local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  QPDFExc local_300;
  allocator<char> local_279;
  string local_278;
  QPDFExc local_258;
  QPDFObjGen local_1d8;
  qpdf_offset_t obj_offset;
  type *entry;
  type *current_og;
  _Self local_1b8;
  iterator __end2;
  iterator __begin2;
  map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
  *__range2;
  QPDFObjGen found_og;
  qpdf_offset_t found_offset;
  qpdf_offset_t end;
  Token t;
  unsigned_long local_118;
  size_t length;
  undefined8 local_108;
  undefined1 local_100 [8];
  PatternFinder ef;
  allocator<char> local_c9;
  string local_c8;
  QPDFExc local_a8;
  qpdf_offset_t local_28;
  qpdf_offset_t stream_offset_local;
  shared_ptr<InputSource> *input_local;
  QPDF *this_local;
  QPDFObjGen og_local;
  
  local_28 = stream_offset;
  stream_offset_local = (qpdf_offset_t)input;
  input_local = (shared_ptr<InputSource> *)this;
  this_local = (QPDF *)og;
  peVar4 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     input);
  qVar6 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"attempting to recover stream length",&local_c9);
  damagedPDF(&local_a8,this,peVar4,qVar6,&local_c8);
  warn(this,&local_a8);
  QPDFExc::~QPDFExc(&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  length = (size_t)findEndstream;
  local_108 = 0;
  PatternFinder::PatternFinder((PatternFinder *)local_100,this,0x387120);
  local_118 = 0;
  pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  peVar4 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &pMVar5->file);
  bVar2 = InputSource::findFirst(peVar4,"end",local_28,0,(Finder *)local_100);
  if (bVar2) {
    pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    peVar4 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&pMVar5->file);
    iVar3 = (*peVar4->_vptr_InputSource[4])();
    t.error_message.field_2._8_8_ = CONCAT44(extraout_var,iVar3) - local_28;
    local_118 = toS<long_long>((longlong *)(t.error_message.field_2._M_local_buf + 8));
    pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    peVar4 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )&pMVar5->file);
    readToken((Token *)&end,this,peVar4,0);
    __lhs = QPDFTokenizer::Token::getValue_abi_cxx11_((Token *)&end);
    bVar2 = std::operator==(__lhs,"endobj");
    if (bVar2) {
      pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      peVar4 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&pMVar5->file);
      pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      this_00 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&pMVar5->file);
      qVar6 = InputSource::getLastOffset(this_00);
      (*peVar4->_vptr_InputSource[5])(peVar4,qVar6,0);
    }
    QPDFTokenizer::Token::~Token((Token *)&end);
  }
  qVar6 = local_28;
  if (local_118 != 0) {
    qVar7 = toO<unsigned_long>(&local_118);
    found_og.obj = 0;
    found_og.gen = 0;
    QPDFObjGen::QPDFObjGen((QPDFObjGen *)&__range2);
    pMVar5 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    __end2 = std::
             map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
             ::begin(&pMVar5->xref_table);
    local_1b8._M_node =
         (_Base_ptr)
         std::
         map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
         ::end(&pMVar5->xref_table);
    while (bVar2 = std::operator!=(&__end2,&local_1b8), bVar2) {
      current_og = &std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>::operator*
                              (&__end2)->first;
      entry = (type *)std::get<0ul,QPDFObjGen_const,QPDFXRefEntry>
                                ((pair<const_QPDFObjGen,_QPDFXRefEntry> *)current_og);
      obj_offset = (qpdf_offset_t)
                   std::get<1ul,QPDFObjGen_const,QPDFXRefEntry>
                             ((pair<const_QPDFObjGen,_QPDFXRefEntry> *)current_og);
      iVar3 = QPDFXRefEntry::getType((QPDFXRefEntry *)obj_offset);
      if (((iVar3 == 1) &&
          (local_1d8 = (QPDFObjGen)QPDFXRefEntry::getOffset((QPDFXRefEntry *)obj_offset),
          (long)found_og < (long)local_1d8)) && ((long)local_1d8 < qVar6 + qVar7)) {
        __range2 = *(map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
                     **)entry;
        found_og = local_1d8;
      }
      std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>::operator++(&__end2);
    }
    if ((found_og != (QPDFObjGen)0x0) &&
       (bVar2 = QPDFObjGen::operator==((QPDFObjGen *)&__range2,(QPDFObjGen *)&this_local), !bVar2))
    {
      QTC::TC("qpdf","QPDF found wrong endstream in recovery",0);
      local_118 = 0;
    }
  }
  if (local_118 == 0) {
    peVar4 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )input);
    qVar6 = local_28;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,"unable to recover stream data; treating stream as empty",
               &local_279);
    damagedPDF(&local_258,this,peVar4,qVar6,&local_278);
    warn(this,&local_258);
    QPDFExc::~QPDFExc(&local_258);
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator(&local_279);
  }
  else {
    peVar4 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )input);
    qVar6 = local_28;
    std::__cxx11::to_string(&local_340,local_118);
    std::operator+(&local_320,"recovered stream length: ",&local_340);
    damagedPDF(&local_300,this,peVar4,qVar6,&local_320);
    warn(this,&local_300);
    QPDFExc::~QPDFExc(&local_300);
    std::__cxx11::string::~string((string *)&local_320);
    std::__cxx11::string::~string((string *)&local_340);
  }
  QTC::TC("qpdf","QPDF recovered stream length",0);
  uVar1 = local_118;
  PatternFinder::~PatternFinder((PatternFinder *)local_100);
  return uVar1;
}

Assistant:

size_t
QPDF::recoverStreamLength(
    std::shared_ptr<InputSource> input, QPDFObjGen og, qpdf_offset_t stream_offset)
{
    // Try to reconstruct stream length by looking for endstream or endobj
    warn(damagedPDF(*input, stream_offset, "attempting to recover stream length"));

    PatternFinder ef(*this, &QPDF::findEndstream);
    size_t length = 0;
    if (m->file->findFirst("end", stream_offset, 0, ef)) {
        length = toS(m->file->tell() - stream_offset);
        // Reread endstream but, if it was endobj, don't skip that.
        QPDFTokenizer::Token t = readToken(*m->file);
        if (t.getValue() == "endobj") {
            m->file->seek(m->file->getLastOffset(), SEEK_SET);
        }
    }

    if (length) {
        auto end = stream_offset + toO(length);
        qpdf_offset_t found_offset = 0;
        QPDFObjGen found_og;

        // Make sure this is inside this object
        for (auto const& [current_og, entry]: m->xref_table) {
            if (entry.getType() == 1) {
                qpdf_offset_t obj_offset = entry.getOffset();
                if (found_offset < obj_offset && obj_offset < end) {
                    found_offset = obj_offset;
                    found_og = current_og;
                }
            }
        }
        if (!found_offset || found_og == og) {
            // If we are trying to recover an XRef stream the xref table will not contain and
            // won't contain any entries, therefore we cannot check the found length. Otherwise we
            // found endstream\nendobj within the space allowed for this object, so we're probably
            // in good shape.
        } else {
            QTC::TC("qpdf", "QPDF found wrong endstream in recovery");
            length = 0;
        }
    }

    if (length == 0) {
        warn(damagedPDF(
            *input, stream_offset, "unable to recover stream data; treating stream as empty"));
    } else {
        warn(damagedPDF(
            *input, stream_offset, "recovered stream length: " + std::to_string(length)));
    }

    QTC::TC("qpdf", "QPDF recovered stream length");
    return length;
}